

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.cpp
# Opt level: O1

Error __thiscall
asmjit::BaseCompiler::_newConst
          (BaseCompiler *this,BaseMem *out,uint32_t scope,void *data,size_t size)

{
  ConstPoolNode **out_00;
  uint32_t uVar1;
  ConstPoolNode *pCVar2;
  Error EVar3;
  long lVar4;
  size_t off;
  uint32_t local_30 [2];
  
  (out->super_Operand).super_Operand_._signature = 2;
  (out->super_Operand).super_Operand_._baseId = 0;
  (out->super_Operand).super_Operand_._data[0] = 0;
  (out->super_Operand).super_Operand_._data[1] = 0;
  if (scope == 0) {
    lVar4 = 0x1a8;
  }
  else {
    if (scope != 1) {
      EVar3 = BaseEmitter::reportError((BaseEmitter *)this,2,(char *)0x0);
      return EVar3;
    }
    lVar4 = 0x1b0;
  }
  out_00 = (ConstPoolNode **)
           ((long)&(this->super_BaseBuilder).super_BaseEmitter._vptr_BaseEmitter + lVar4);
  if ((*(long *)((long)&(this->super_BaseBuilder).super_BaseEmitter._vptr_BaseEmitter + lVar4) == 0)
     && (EVar3 = BaseBuilder::_newConstPoolNode(&this->super_BaseBuilder,out_00), EVar3 != 0)) {
    return EVar3;
  }
  pCVar2 = *out_00;
  EVar3 = ConstPool::add(&pCVar2->_constPool,data,size,(size_t *)local_30);
  if (EVar3 == 0) {
    uVar1 = (pCVar2->super_LabelNode)._labelId;
    (out->super_Operand).super_Operand_._signature = (int)size << 0x18 | 10;
    (out->super_Operand).super_Operand_._baseId = uVar1;
    (out->super_Operand).super_Operand_._data[0] = 0;
    (out->super_Operand).super_Operand_._data[1] = local_30[0];
    EVar3 = 0;
  }
  else {
    EVar3 = BaseEmitter::reportError((BaseEmitter *)this,EVar3,(char *)0x0);
  }
  return EVar3;
}

Assistant:

Error BaseCompiler::_newConst(BaseMem* out, uint32_t scope, const void* data, size_t size) {
  out->reset();
  ConstPoolNode** pPool;

  if (scope == ConstPool::kScopeLocal)
    pPool = &_localConstPool;
  else if (scope == ConstPool::kScopeGlobal)
    pPool = &_globalConstPool;
  else
    return reportError(DebugUtils::errored(kErrorInvalidArgument));

  if (!*pPool)
    ASMJIT_PROPAGATE(_newConstPoolNode(pPool));

  ConstPoolNode* pool = *pPool;
  size_t off;
  Error err = pool->add(data, size, off);

  if (ASMJIT_UNLIKELY(err))
    return reportError(err);

  *out = BaseMem(BaseMem::Decomposed {
    Label::kLabelTag,      // Base type.
    pool->labelId(),       // Base id.
    0,                     // Index type.
    0,                     // Index id.
    int32_t(off),          // Offset.
    uint32_t(size),        // Size.
    0                      // Flags.
  });

  return kErrorOk;
}